

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O1

void RGB24ToYJRow_SSSE3(uint8_t *src_rgb24,uint8_t *dst_yj,int width)

{
  bool bVar1;
  uint uVar2;
  int width_00;
  ulong uVar3;
  uint8_t row [8192];
  uint8_t auStack_2060 [8240];
  
  if (0 < width) {
    do {
      uVar3 = 0x800;
      if (width < 0x800) {
        uVar3 = (ulong)(uint)width;
      }
      width_00 = (int)uVar3;
      RGB24ToARGBRow_SSSE3(src_rgb24,auStack_2060,width_00);
      ARGBToYJRow_SSSE3(auStack_2060,dst_yj,width_00);
      src_rgb24 = src_rgb24 + (uint)(width_00 * 3);
      dst_yj = dst_yj + uVar3;
      uVar2 = width - width_00;
      bVar1 = width_00 <= width;
      width = uVar2;
    } while (uVar2 != 0 && bVar1);
  }
  return;
}

Assistant:

void RGB24ToYJRow_SSSE3(const uint8_t* src_rgb24, uint8_t* dst_yj, int width) {
  // Row buffer for intermediate ARGB pixels.
  SIMD_ALIGNED(uint8_t row[MAXTWIDTH * 4]);
  while (width > 0) {
    int twidth = width > MAXTWIDTH ? MAXTWIDTH : width;
    RGB24ToARGBRow_SSSE3(src_rgb24, row, twidth);
    ARGBToYJRow_SSSE3(row, dst_yj, twidth);
    src_rgb24 += twidth * 3;
    dst_yj += twidth;
    width -= twidth;
  }
}